

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  char *pcVar1;
  void *ttf_data;
  size_t sVar2;
  char *pcVar3;
  ImFont *pIVar4;
  size_t data_size;
  size_t local_b8;
  ImFontConfig local_b0;
  
  if (this->Locked == true) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x779,"AddFontFromFileTTF","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  local_b8 = 0;
  ttf_data = ImFileLoadToMemory(filename,"rb",&local_b8,0);
  if (ttf_data == (void *)0x0) {
    pIVar4 = (ImFont *)0x0;
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x77e,"AddFontFromFileTTF","ImGui ASSERT FAILED: %s",
                "(0) && \"Could not load font file!\"");
  }
  else {
    if (font_cfg_template == (ImFontConfig *)0x0) {
      local_b0.FontData = (void *)0x0;
      local_b0.FontDataSize = 0;
      local_b0.GlyphExtraSpacing.x = 0.0;
      local_b0.GlyphExtraSpacing.y = 0.0;
      local_b0.GlyphOffset.x = 0.0;
      local_b0.GlyphOffset.y = 0.0;
      local_b0.FontDataOwnedByAtlas = true;
      local_b0.FontNo = 0;
      local_b0.SizePixels = 0.0;
      local_b0.OversampleH = 3;
      local_b0.OversampleV = 1;
      local_b0.PixelSnapH = false;
      local_b0.GlyphRanges = (ImWchar *)0x0;
      local_b0.GlyphMinAdvanceX = 0.0;
      local_b0.GlyphMaxAdvanceX = 3.4028235e+38;
      local_b0.MergeMode = false;
      local_b0.RasterizerFlags = 0;
      local_b0.RasterizerMultiply = 1.0;
      local_b0.EllipsisChar = 0xffff;
      local_b0.Name[0] = '\0';
      local_b0.Name[1] = '\0';
      local_b0.Name[2] = '\0';
      local_b0.Name[3] = '\0';
      local_b0.Name[4] = '\0';
      local_b0.Name[5] = '\0';
      local_b0.Name[6] = '\0';
      local_b0.Name[7] = '\0';
      local_b0.Name[8] = '\0';
      local_b0.Name[9] = '\0';
      local_b0.Name[10] = '\0';
      local_b0.Name[0xb] = '\0';
      local_b0.Name[0xc] = '\0';
      local_b0.Name[0xd] = '\0';
      local_b0.Name[0xe] = '\0';
      local_b0.Name[0xf] = '\0';
      local_b0.Name[0x10] = '\0';
      local_b0.Name[0x11] = '\0';
      local_b0.Name[0x12] = '\0';
      local_b0.Name[0x13] = '\0';
      local_b0.Name[0x14] = '\0';
      local_b0.Name[0x15] = '\0';
      local_b0.Name[0x16] = '\0';
      local_b0.Name[0x17] = '\0';
      local_b0.Name[0x18] = '\0';
      local_b0.Name[0x19] = '\0';
      local_b0.Name[0x1a] = '\0';
      local_b0.Name[0x1b] = '\0';
      local_b0.Name[0x1c] = '\0';
      local_b0.Name[0x1d] = '\0';
      local_b0.Name[0x1e] = '\0';
      local_b0.Name[0x1f] = '\0';
      local_b0.Name[0x20] = '\0';
      local_b0.Name[0x21] = '\0';
      local_b0.Name[0x22] = '\0';
      local_b0.Name[0x23] = '\0';
      local_b0.Name[0x24] = '\0';
      local_b0.Name[0x25] = '\0';
      local_b0.Name[0x26] = '\0';
      local_b0.Name[0x27] = '\0';
      local_b0.DstFont = (ImFont *)0x0;
    }
    else {
      memcpy(&local_b0,font_cfg_template,0x88);
    }
    if (local_b0.Name[0] == '\0') {
      sVar2 = strlen(filename);
      pcVar3 = filename + sVar2;
      do {
        if ((pcVar3 <= filename) || (pcVar1 = pcVar3 + -1, *pcVar1 == '\\')) break;
        pcVar3 = pcVar3 + -1;
      } while (*pcVar1 != '/');
      ImFormatString(local_b0.Name,0x28,"%s, %.0fpx",SUB84((double)size_pixels,0));
    }
    pIVar4 = AddFontFromMemoryTTF(this,ttf_data,(int)local_b8,size_pixels,&local_b0,glyph_ranges);
  }
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT_USER_ERROR(0, "Could not load font file!");
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}